

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_lsa(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt,int imm2)

{
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 a2;
  TCGArg a2_00;
  uintptr_t o_2;
  TCGOpcode TVar1;
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o_3;
  TCGv_i64 ret;
  
  if (rd == 0) {
    return;
  }
  a1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)ctx);
  a1_00 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  if (rs == 0) {
    TVar1 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_009861b9:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar1,(TCGArg)a1,(TCGArg)a2);
  }
  else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) != ret) {
    a2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) + (long)ctx;
    TVar1 = INDEX_op_mov_i64;
    goto LAB_009861b9;
  }
  if (rt == 0) {
    TVar1 = INDEX_op_movi_i64;
    a2_00 = 0;
  }
  else {
    if (*(long *)(&ctx[0xf9].gi + (long)rt * 2) == (long)a1_00 - (long)ctx) goto LAB_00986200;
    a2_00 = (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rt * 2);
    TVar1 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar1,(TCGArg)a1_00,a2_00);
LAB_00986200:
  tcg_gen_shli_i64_mips64el((TCGContext_conflict6 *)ctx,ret,ret,(ulong)(imm2 + 1));
  tcg_gen_op3_mips64el
            ((TCGContext_conflict6 *)ctx,INDEX_op_add_i64,
             (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),(TCGArg)a1,
             (TCGArg)a1_00);
  if (opc == 5) {
    tcg_gen_ext32s_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),
               *(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2));
  }
  tcg_temp_free_internal_mips64el
            ((TCGContext_conflict6 *)ctx,(TCGTemp *)(((long)a1_00 - (long)ctx) + (long)ctx));
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(ret + (long)ctx));
  return;
}

Assistant:

static void gen_lsa(DisasContext *ctx, int opc, int rd, int rs, int rt,
                    int imm2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    tcg_gen_shli_tl(tcg_ctx, t0, t0, imm2 + 1);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
    if (opc == OPC_LSA) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);

    return;
}